

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall Matrix<int>::Matrix(Matrix<int> *this,int a,int b)

{
  int i;
  int **ppiVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  this->n = a;
  this->m = b;
  uVar6 = 0;
  uVar5 = (ulong)(uint)a << 3;
  if (a < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar7 = 0;
  if (0 < a) {
    uVar7 = (ulong)(uint)a;
  }
  ppiVar1 = (int **)operator_new__(uVar5);
  this->M = ppiVar1;
  uVar5 = (ulong)(uint)b << 2;
  if (b < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    piVar2 = (int *)operator_new__(uVar5);
    this->M[uVar6] = piVar2;
  }
  for (lVar3 = 0; lVar3 < a; lVar3 = lVar3 + 1) {
    ppiVar1 = this->M;
    for (lVar4 = 0; lVar4 < b; lVar4 = lVar4 + 1) {
      ppiVar1[lVar3][lVar4] = 0;
      b = this->m;
    }
    a = this->n;
  }
  return;
}

Assistant:

Matrix(int a, int b) {
    n = a;
    m = b;
    M = new T*[n];
    for (int i = 0; i < n; i++) {
      M[i] = new T[m];
    }
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        M[i][j] = 0;
      }
    }
  }